

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O0

ASTNode * ParseReturn(Scope *scope,Lexer *lexer)

{
  ASTNode *pAVar1;
  ASTNode *pAVar2;
  ASTNode *var;
  Lexer *lexer_local;
  Scope *scope_local;
  
  pAVar1 = GetNextNode(scope);
  pAVar1->type = RETURN;
  pAVar2 = ParseExpression(scope,lexer);
  (pAVar1->meta).binaryExpr.left = pAVar2;
  pAVar1->isStmt = true;
  return pAVar1;
}

Assistant:

ASTNode* ParseReturn(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Return");
	TRACK();
	ASTNode* var = GetNextNode(scope);
	SET_NODE_TYPE(var, RETURN);
	SET_RETURN_VALUE(var, ParseExpression(scope, lexer));
	SET_IS_STMT(var);
	return var;
}